

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

BinaryEventExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryEventExpressionSyntax,slang::syntax::BinaryEventExpressionSyntax_const&>
          (BumpAllocator *this,BinaryEventExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  EventExpressionSyntax *pEVar3;
  Info *pIVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  BinaryEventExpressionSyntax *pBVar10;
  
  pBVar10 = (BinaryEventExpressionSyntax *)allocate(this,0x38,8);
  uVar5 = *(undefined4 *)
           &(args->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.parent;
  pSVar2 = (args->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.previewNode
  ;
  pEVar3 = (args->left).ptr;
  TVar6 = (args->operatorToken).kind;
  uVar7 = (args->operatorToken).field_0x2;
  NVar8.raw = (args->operatorToken).numFlags.raw;
  uVar9 = (args->operatorToken).rawLen;
  pIVar4 = (args->operatorToken).info;
  (pBVar10->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.kind =
       (args->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pBVar10->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.field_0x4 =
       uVar5;
  (pBVar10->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.parent = pSVar1;
  (pBVar10->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.previewNode =
       pSVar2;
  (pBVar10->left).ptr = pEVar3;
  (pBVar10->operatorToken).kind = TVar6;
  (pBVar10->operatorToken).field_0x2 = uVar7;
  (pBVar10->operatorToken).numFlags = (NumericTokenFlags)NVar8.raw;
  (pBVar10->operatorToken).rawLen = uVar9;
  (pBVar10->operatorToken).info = pIVar4;
  (pBVar10->right).ptr = (args->right).ptr;
  return pBVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }